

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeI31Get(TranslateToFuzzReader *this,Type type)

{
  bool signed_;
  Expression *i31;
  I31Get *pIVar1;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1431,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) == 0) {
    i31 = makeTrappingRefUse(this,(HeapType)0x30);
    signed_ = Random::oneIn(&this->random,2);
    pIVar1 = Builder::makeI31Get(&this->builder,i31,signed_);
    return (Expression *)pIVar1;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1432,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeI31Get(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* i31 = makeTrappingRefUse(HeapType::i31);
  return builder.makeI31Get(i31, bool(oneIn(2)));
}